

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTask::IfcTask(IfcTask *this,void **vtt)

{
  void **vtt_local;
  IfcTask *this_local;
  
  IfcProcess::IfcProcess((IfcProcess *)this,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>,vtt + 0x17);
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x1d];
  std::__cxx11::string::string
            ((string *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>).field_0x10
            );
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Status);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->WorkMethod);
  std::__cxx11::string::string((string *)&this->IsMilestone);
  STEP::Maybe<long>::Maybe(&this->Priority);
  return;
}

Assistant:

IfcTask() : Object("IfcTask") {}